

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::deviceFeatures(TestStatus *__return_storage_ptr__,Context *context)

{
  bool bVar1;
  TestContext *this;
  TestLog *this_00;
  InstanceInterface *pIVar2;
  VkPhysicalDevice pVVar3;
  MessageBuilder *pMVar4;
  TestLog *this_01;
  allocator<char> local_b91;
  string local_b90;
  allocator<char> local_b69;
  string local_b68;
  MessageBuilder local_b48;
  undefined8 local_9c8;
  undefined8 local_9c0;
  allocator<char> local_9b1;
  string local_9b0;
  MessageBuilder local_990;
  int local_810;
  allocator<char> local_809;
  int ndx;
  allocator<char> local_7e1;
  string local_7e0;
  VkPhysicalDevice local_7c0 [3];
  MessageBuilder local_7a8;
  MessageBuilder local_628;
  undefined1 local_4a8 [8];
  QueryMemberTableEntry featureOffsetTable [56];
  deUint8 buffer [252];
  VkPhysicalDeviceFeatures *features;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  this_00 = tcu::TestContext::getLog(this);
  memcpy(local_4a8,&DAT_013032f0,0x380);
  ::deMemset(&featureOffsetTable[0x37].size,0xcd,0xfc);
  unique0x100005fd = (VkPhysicalDeviceFeatures *)&featureOffsetTable[0x37].size;
  pIVar2 = Context::getInstanceInterface(context);
  pVVar3 = Context::getPhysicalDevice(context);
  (*pIVar2->_vptr_InstanceInterface[2])(pIVar2,pVVar3,stack0xffffffffffffffd8);
  tcu::TestLog::operator<<(&local_7a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_7a8,(char (*) [10])"device = ");
  local_7c0[0] = Context::getPhysicalDevice(context);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_7c0);
  this_01 = tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_628,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_628,stack0xffffffffffffffd8);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_628);
  tcu::MessageBuilder::~MessageBuilder(&local_7a8);
  if (stack0xffffffffffffffd8->robustBufferAccess == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e0,"robustBufferAccess is not supported",&local_7e1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_7e0);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator(&local_7e1);
  }
  else if ((stack0xffffffffffffffd8->multiViewport == 0) ||
          (stack0xffffffffffffffd8->geometryShader != 0)) {
    for (local_810 = 0; local_810 < 0x20; local_810 = local_810 + 1) {
      if (buffer[(long)local_810 + 0xd4] != 0xcd) {
        tcu::TestLog::operator<<(&local_990,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_990,(char (*) [31])"deviceFeatures - Guard offset ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_810);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])0x12f598a);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_990);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9b0,"deviceFeatures buffer overflow",&local_9b1);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_9b0);
        std::__cxx11::string::~string((string *)&local_9b0);
        std::allocator<char>::~allocator(&local_9b1);
        return __return_storage_ptr__;
      }
    }
    pVVar3 = Context::getPhysicalDevice(context);
    pIVar2 = Context::getInstanceInterface(context);
    local_9c0 = 0;
    local_9c8 = 0x11;
    bVar1 = ::vk::ValidateQueryBits::
            validateInitComplete<vk::VkPhysicalDevice_s*,vk::InstanceInterface,vk::VkPhysicalDeviceFeatures>
                      ((ValidateQueryBits *)pVVar3,(VkPhysicalDevice_s *)0x11,0,pIVar2,
                       (QueryMemberTableEntry *)local_4a8);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b90,"Query succeeded",&local_b91);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_b90);
      std::__cxx11::string::~string((string *)&local_b90);
      std::allocator<char>::~allocator(&local_b91);
    }
    else {
      tcu::TestLog::operator<<(&local_b48,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_b48,
                          (char (*) [69])
                          "deviceFeatures - VkPhysicalDeviceFeatures not completely initialized");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_b48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b68,"deviceFeatures incomplete initialization",&local_b69);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_b68);
      std::__cxx11::string::~string((string *)&local_b68);
      std::allocator<char>::~allocator(&local_b69);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ndx,"multiViewport is supported but geometryShader is not",&local_809);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&ndx);
    std::__cxx11::string::~string((string *)&ndx);
    std::allocator<char>::~allocator(&local_809);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceFeatures (Context& context)
{
	using namespace ValidateQueryBits;

	TestLog&						log			= context.getTestContext().getLog();
	VkPhysicalDeviceFeatures*		features;
	deUint8							buffer[sizeof(VkPhysicalDeviceFeatures) + GUARD_SIZE];

	const QueryMemberTableEntry featureOffsetTable[] =
	{
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, robustBufferAccess),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, fullDrawIndexUint32),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, imageCubeArray),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, independentBlend),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, geometryShader),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, tessellationShader),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sampleRateShading),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, dualSrcBlend),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, logicOp),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, multiDrawIndirect),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, drawIndirectFirstInstance),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, depthClamp),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, depthBiasClamp),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, fillModeNonSolid),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, depthBounds),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, wideLines),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, largePoints),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, alphaToOne),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, multiViewport),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, samplerAnisotropy),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, textureCompressionETC2),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, textureCompressionASTC_LDR),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, textureCompressionBC),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, occlusionQueryPrecise),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, pipelineStatisticsQuery),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, vertexPipelineStoresAndAtomics),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, fragmentStoresAndAtomics),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderTessellationAndGeometryPointSize),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderImageGatherExtended),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageExtendedFormats),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageMultisample),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageReadWithoutFormat),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageWriteWithoutFormat),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderUniformBufferArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderSampledImageArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageBufferArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderClipDistance),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderCullDistance),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderFloat64),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderInt64),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderInt16),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderResourceResidency),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderResourceMinLod),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseBinding),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyBuffer),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyImage2D),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyImage3D),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency2Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency4Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency8Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency16Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyAliased),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, variableMultisampleRate),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, inheritedQueries),
		{ 0, 0 }
	};

	deMemset(buffer, GUARD_VALUE, sizeof(buffer));
	features = reinterpret_cast<VkPhysicalDeviceFeatures*>(buffer);

	context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), features);

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage
		<< TestLog::Message << *features << TestLog::EndMessage;

	// Requirements and dependencies
	{
		if (!features->robustBufferAccess)
			return tcu::TestStatus::fail("robustBufferAccess is not supported");

		// multiViewport requires MultiViewport (SPIR-V capability) support, which depends on Geometry
		if (features->multiViewport && !features->geometryShader)
			return tcu::TestStatus::fail("multiViewport is supported but geometryShader is not");
	}

	for (int ndx = 0; ndx < GUARD_SIZE; ndx++)
	{
		if (buffer[ndx + sizeof(VkPhysicalDeviceFeatures)] != GUARD_VALUE)
		{
			log << TestLog::Message << "deviceFeatures - Guard offset " << ndx << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceFeatures buffer overflow");
		}
	}

	if (!validateInitComplete(context.getPhysicalDevice(), &InstanceInterface::getPhysicalDeviceFeatures, context.getInstanceInterface(), featureOffsetTable))
	{
		log << TestLog::Message << "deviceFeatures - VkPhysicalDeviceFeatures not completely initialized" << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceFeatures incomplete initialization");
	}

	return tcu::TestStatus::pass("Query succeeded");
}